

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

char * stbtt_GetFontNameString
                 (stbtt_fontinfo *font,int *length,int platformID,int encodingID,int languageID,
                 int nameID)

{
  stbtt_uint8 *data;
  bool bVar1;
  stbtt_uint32 sVar2;
  uint uVar3;
  uint uVar4;
  stbtt_uint8 *psVar5;
  ushort uVar6;
  ulong uVar7;
  
  data = font->data;
  sVar2 = stbtt__find_table(data,font->fontstart,"name");
  if (sVar2 != 0) {
    uVar6 = *(ushort *)(data + (ulong)sVar2 + 2) << 8 | *(ushort *)(data + (ulong)sVar2 + 2) >> 8;
    if (uVar6 != 0) {
      uVar4 = (ushort)(*(ushort *)(data + (ulong)sVar2 + 4) << 8 |
                      *(ushort *)(data + (ulong)sVar2 + 4) >> 8) + sVar2;
      psVar5 = (stbtt_uint8 *)(ulong)uVar4;
      uVar3 = sVar2 + 6;
      uVar7 = (ulong)uVar6;
      do {
        bVar1 = true;
        if (((((uint)(ushort)(*(ushort *)(data + uVar3) << 8 | *(ushort *)(data + uVar3) >> 8) ==
               platformID) &&
             ((uint)(ushort)(*(ushort *)(data + (ulong)uVar3 + 2) << 8 |
                            *(ushort *)(data + (ulong)uVar3 + 2) >> 8) == encodingID)) &&
            ((uint)(ushort)(*(ushort *)(data + (ulong)uVar3 + 4) << 8 |
                           *(ushort *)(data + (ulong)uVar3 + 4) >> 8) == languageID)) &&
           ((uint)(ushort)(*(ushort *)(data + (ulong)uVar3 + 6) << 8 |
                          *(ushort *)(data + (ulong)uVar3 + 6) >> 8) == nameID)) {
          *length = (uint)(ushort)(*(ushort *)(data + (ulong)uVar3 + 8) << 8 |
                                  *(ushort *)(data + (ulong)uVar3 + 8) >> 8);
          psVar5 = data + (ulong)(ushort)(*(ushort *)(data + (ulong)uVar3 + 10) << 8 |
                                         *(ushort *)(data + (ulong)uVar3 + 10) >> 8) +
                          (long)(int)uVar4;
          bVar1 = false;
        }
        if (!bVar1) {
          return (char *)psVar5;
        }
        uVar3 = uVar3 + 0xc;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
  }
  return (char *)0x0;
}

Assistant:

STBTT_DEF const char *stbtt_GetFontNameString(const stbtt_fontinfo *font, int *length, int platformID, int encodingID, int languageID, int nameID)
{
   stbtt_int32 i,count,stringOffset;
   stbtt_uint8 *fc = font->data;
   stbtt_uint32 offset = font->fontstart;
   stbtt_uint32 nm = stbtt__find_table(fc, offset, "name");
   if (!nm) return NULL;

   count = ttUSHORT(fc+nm+2);
   stringOffset = nm + ttUSHORT(fc+nm+4);
   for (i=0; i < count; ++i) {
      stbtt_uint32 loc = nm + 6 + 12 * i;
      if (platformID == ttUSHORT(fc+loc+0) && encodingID == ttUSHORT(fc+loc+2)
          && languageID == ttUSHORT(fc+loc+4) && nameID == ttUSHORT(fc+loc+6)) {
         *length = ttUSHORT(fc+loc+8);
         return (const char *) (fc+stringOffset+ttUSHORT(fc+loc+10));
      }
   }
   return NULL;
}